

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec3.h
# Opt level: O0

vec3 * random_in_unit_disk(void)

{
  vec3 *in_RDI;
  double dVar1;
  double e1;
  vec3 *p;
  
  do {
    dVar1 = random_double(-1.0,1.0);
    e1 = random_double(-1.0,1.0);
    vec3::vec3(in_RDI,dVar1,e1,0.0);
    dVar1 = vec3::length_squared(in_RDI);
  } while (1.0 <= dVar1);
  return in_RDI;
}

Assistant:

inline vec3 random_in_unit_disk() {
    while (true) {
        auto p = vec3(random_double(-1,1), random_double(-1,1), 0);
        if (p.length_squared() >= 1) continue;
        return p;
    }
}